

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O0

void __thiscall Cmd::editMovePrevWord(Cmd *this,State *state)

{
  char *pcVar1;
  bool bVar2;
  State *state_local;
  Cmd *this_local;
  
  while( true ) {
    bVar2 = false;
    if (state->pos != 0) {
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)state);
      bVar2 = *pcVar1 == ' ';
    }
    if (!bVar2) break;
    state->pos = state->pos - 1;
  }
  while( true ) {
    bVar2 = false;
    if (state->pos != 0) {
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)state);
      bVar2 = *pcVar1 != ' ';
    }
    if (!bVar2) break;
    state->pos = state->pos - 1;
  }
  refreshLine(this,state);
  return;
}

Assistant:

void editMovePrevWord(State *state) {
		while (state->pos > 0 && state->buf[state->pos - 1] == ' ')
			state->pos--;

		while (state->pos > 0 && state->buf[state->pos - 1] != ' ')
			state->pos--;

		refreshLine(state);
	}